

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_ge_serialize_ext(uchar *out33,secp256k1_ge *ge)

{
  int iVar1;
  void *in_RDI;
  size_t size;
  int ret;
  size_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x109fc8);
  if (iVar1 == 0) {
    secp256k1_eckey_pubkey_serialize
              ((secp256k1_ge *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (uchar *)0x21,in_stack_ffffffffffffffd8,0);
  }
  else {
    memset(in_RDI,0,0x21);
  }
  return;
}

Assistant:

static void secp256k1_musig_ge_serialize_ext(unsigned char *out33, secp256k1_ge* ge) {
    if (secp256k1_ge_is_infinity(ge)) {
        memset(out33, 0, 33);
    } else {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(ge, out33, &size, 1);
#ifdef VERIFY
        /* Serialize must succeed because the point is not at infinity */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
}